

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

AffineSpace3fa * __thiscall
embree::CoronaLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (AffineSpace3fa *__return_storage_ptr__,CoronaLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  runtime_error *this_01;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uStack_b0;
  ulong uStack_a0;
  ulong uStack_90;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x360) {
    fVar2 = Token::Float(this_00,true);
    fVar3 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,true);
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 2,true);
    fVar5 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 4,true);
    fVar6 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 5,true);
    fVar7 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 6,true);
    fVar8 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 8,true);
    fVar9 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 9,true);
    fVar10 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 10,true);
    fVar11 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 3,true);
    fVar12 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 7,true);
    fVar13 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 0xb,true);
    uStack_90 = (ulong)(uint)fVar8;
    *(ulong *)&(__return_storage_ptr__->l).vx.field_0 = CONCAT44(fVar5,fVar2);
    *(ulong *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uStack_90;
    uStack_a0 = (ulong)(uint)fVar9;
    *(ulong *)&(__return_storage_ptr__->l).vy.field_0 = CONCAT44(fVar6,fVar3);
    *(ulong *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uStack_a0;
    uStack_b0 = (ulong)(uint)fVar10;
    *(ulong *)&(__return_storage_ptr__->l).vz.field_0 = CONCAT44(fVar7,fVar4);
    *(ulong *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_b0;
    aVar1.m128[1] = fVar12;
    aVar1.m128[0] = fVar11;
    aVar1.m128[2] = fVar13;
    aVar1.m128[3] = 0.0;
    (__return_storage_ptr__->p).field_0 = aVar1;
    return __return_storage_ptr__;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_58,&xml->ptr->loc);
  std::operator+(&local_38,&local_58,": wrong AffineSpace body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AffineSpace3fa CoronaLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                         xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                         xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                          Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
  }